

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessageTimer.cpp
# Opt level: O1

bool __thiscall
helics::MessageTimer::updateTimer(MessageTimer *this,int32_t timerIndex,time_type expirationTime)

{
  action_t aVar1;
  pointer psVar2;
  element_type *peVar3;
  deadline_timer_service<asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>
  *pdVar4;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var5;
  int iVar6;
  wait_handler<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_GMLC_TDC[P]HELICS_src_helics_core_MessageTimer_cpp:131:30),_asio::any_io_executor>
  *op;
  op_cancellation *poVar7;
  pthread_mutex_t *__mutex;
  undefined8 uVar8;
  implementation_type *impl;
  long *in_FS_OFFSET;
  bool bVar9;
  associated_cancellation_slot_t<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_GMLC_TDC[P]HELICS_src_helics_core_MessageTimer_cpp:131:30)>
  slot;
  type timerCallback;
  type local_a8;
  pthread_mutex_t *local_88;
  ptr local_80;
  cancellation_slot local_68;
  element_type *local_60;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_58;
  int32_t local_50;
  wait_handler<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_GMLC_TDC[P]HELICS_src_helics_core_MessageTimer_cpp:131:30),_asio::any_io_executor>
  *local_48;
  per_timer_data *local_40;
  deadline_timer_service<asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>
  *local_38;
  
  __mutex = (pthread_mutex_t *)&this->timerLock;
  iVar6 = pthread_mutex_lock(__mutex);
  if (iVar6 == 0) {
    if ((timerIndex < 0) ||
       (psVar2 = (this->timers).
                 super__Vector_base<std::shared_ptr<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::any_io_executor>_>,_std::allocator<std::shared_ptr<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::any_io_executor>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start,
       (int)((ulong)((long)(this->timers).
                           super__Vector_base<std::shared_ptr<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::any_io_executor>_>,_std::allocator<std::shared_ptr<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::any_io_executor>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish - (long)psVar2) >> 4) <=
       timerIndex)) {
      bVar9 = false;
    }
    else {
      peVar3 = psVar2[(uint)timerIndex].
               super___shared_ptr<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::any_io_executor>,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr;
      local_80.h = (type *)((ulong)local_80.h & 0xffffffff00000000);
      local_88 = __mutex;
      local_80.v = (wait_handler<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_GMLC_TDC[P]HELICS_src_helics_core_MessageTimer_cpp:131:30),_asio::any_io_executor>
                    *)std::_V2::system_category();
      impl = (implementation_type *)((long)&peVar3->impl_ + 8);
      local_48 = local_80.v;
      ::asio::detail::
      deadline_timer_service<asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>
      ::cancel((peVar3->impl_).service_,impl,(error_code *)&local_80);
      (impl->expiry).__d.__r = (rep)expirationTime.__d.__r;
      std::__shared_ptr<helics::MessageTimer,(__gnu_cxx::_Lock_policy)2>::
      __shared_ptr<helics::MessageTimer,void>
                ((__shared_ptr<helics::MessageTimer,(__gnu_cxx::_Lock_policy)2> *)&local_60,
                 (__weak_ptr<helics::MessageTimer,_(__gnu_cxx::_Lock_policy)2> *)this);
      (this->expirationTimes).
      super__Vector_base<std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>,_std::allocator<std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start[(uint)timerIndex].__d.__r =
           (rep)expirationTime.__d.__r;
      aVar1 = (this->buffers).
              super__Vector_base<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>.
              _M_impl.super__Vector_impl_data._M_start[(uint)timerIndex].messageAction;
      peVar3 = (this->timers).
               super__Vector_base<std::shared_ptr<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::any_io_executor>_>,_std::allocator<std::shared_ptr<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::any_io_executor>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start[(uint)timerIndex].
               super___shared_ptr<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::any_io_executor>,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr;
      local_a8.ptr.super___shared_ptr<helics::MessageTimer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           local_60;
      local_a8.ptr.super___shared_ptr<helics::MessageTimer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58;
      if (local_58 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          local_58->_M_use_count = local_58->_M_use_count + 1;
          UNLOCK();
        }
        else {
          local_58->_M_use_count = local_58->_M_use_count + 1;
        }
      }
      pdVar4 = (peVar3->impl_).service_;
      local_68.handler_ = (cancellation_handler_base **)0x0;
      if (*(long *)(*in_FS_OFFSET + -0x1420) == 0) {
        uVar8 = 0;
      }
      else {
        uVar8 = *(undefined8 *)(*(long *)(*in_FS_OFFSET + -0x1420) + 8);
      }
      local_a8.timerIndex = timerIndex;
      local_80.h = &local_a8;
      local_50 = timerIndex;
      op = (wait_handler<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_GMLC_TDC[P]HELICS_src_helics_core_MessageTimer_cpp:131:30),_asio::any_io_executor>
            *)::asio::detail::thread_info_base::
              allocate<asio::detail::thread_info_base::default_tag>(uVar8,0x80,8);
      _Var5._M_pi = local_a8.ptr.
                    super___shared_ptr<helics::MessageTimer,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                    ._M_pi;
      local_80.p = (wait_handler<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_GMLC_TDC[P]HELICS_src_helics_core_MessageTimer_cpp:131:30),_asio::any_io_executor>
                    *)0x0;
      (op->super_wait_op).super_operation.next_ = (scheduler_operation *)0x0;
      (op->super_wait_op).super_operation.func_ =
           ::asio::detail::
           wait_handler<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/core/MessageTimer.cpp:131:30),_asio::any_io_executor>
           ::do_complete;
      (op->super_wait_op).super_operation.task_result_ = 0;
      (op->super_wait_op).ec_._M_value = 0;
      (op->super_wait_op).ec_._M_cat = (error_category *)local_48;
      (op->super_wait_op).cancellation_key_ = (void *)0x0;
      (op->handler_).ptr.super___shared_ptr<helics::MessageTimer,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_a8.ptr.super___shared_ptr<helics::MessageTimer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      (op->handler_).ptr.super___shared_ptr<helics::MessageTimer,_(__gnu_cxx::_Lock_policy)2>._M_ptr
           = local_a8.ptr.super___shared_ptr<helics::MessageTimer,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
      (op->handler_).ptr.super___shared_ptr<helics::MessageTimer,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = _Var5._M_pi;
      local_a8.ptr.super___shared_ptr<helics::MessageTimer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      (op->handler_).timerIndex = local_a8.timerIndex;
      local_80.v = op;
      ::asio::detail::
      handler_work_base<asio::any_io_executor,_void,_asio::io_context,_asio::executor,_void>::
      handler_work_base(&(op->work_).
                         super_handler_work_base<asio::any_io_executor,_void,_asio::io_context,_asio::executor,_void>
                        ,0,0,(executor_type *)((long)&peVar3->impl_ + 0x40));
      local_80.p = op;
      if (local_68.handler_ != (cancellation_handler_base **)0x0) {
        local_40 = (per_timer_data *)((long)&peVar3->impl_ + 0x18);
        local_38 = pdVar4;
        poVar7 = ::asio::cancellation_slot::
                 emplace<asio::detail::deadline_timer_service<asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,asio::wait_traits<std::chrono::_V2::steady_clock>>>::op_cancellation,asio::detail::deadline_timer_service<asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,asio::wait_traits<std::chrono::_V2::steady_clock>>>*,asio::detail::timer_queue<asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,asio::wait_traits<std::chrono::_V2::steady_clock>>>::per_timer_data*>
                           (&local_68,&local_38,&local_40);
        (op->super_wait_op).cancellation_key_ = poVar7;
      }
      *(bool *)((long)&peVar3->impl_ + 0x10) = true;
      ::asio::detail::epoll_reactor::
      schedule_timer<asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,asio::wait_traits<std::chrono::_V2::steady_clock>>>
                ((epoll_reactor *)pdVar4->scheduler_,&pdVar4->timer_queue_,
                 (time_type *)((long)&peVar3->impl_ + 8),
                 (per_timer_data *)((long)&peVar3->impl_ + 0x18),(wait_op *)op);
      local_80.v = (wait_handler<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_GMLC_TDC[P]HELICS_src_helics_core_MessageTimer_cpp:131:30),_asio::any_io_executor>
                    *)0x0;
      local_80.p = (wait_handler<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_GMLC_TDC[P]HELICS_src_helics_core_MessageTimer_cpp:131:30),_asio::any_io_executor>
                    *)0x0;
      ::asio::detail::
      wait_handler<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/core/MessageTimer.cpp:131:30),_asio::any_io_executor>
      ::ptr::reset(&local_80);
      __mutex = local_88;
      if (local_a8.ptr.super___shared_ptr<helics::MessageTimer,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        CLI::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   local_a8.ptr.super___shared_ptr<helics::MessageTimer,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi);
      }
      bVar9 = aVar1 != cmd_ignore;
      if (local_58 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        CLI::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_58);
      }
    }
    pthread_mutex_unlock(__mutex);
    return bVar9;
  }
  std::__throw_system_error(iVar6);
}

Assistant:

bool MessageTimer::updateTimer(int32_t timerIndex, time_type expirationTime)
{
    std::lock_guard<std::mutex> lock(timerLock);
    if ((timerIndex >= 0) && (timerIndex < static_cast<int32_t>(timers.size()))) {
        timers[timerIndex]->expires_at(expirationTime);
        auto timerCallback = [ptr = shared_from_this(), timerIndex](const std::error_code& ec) {
            processTimerCallback(ptr, timerIndex, ec);
        };
        expirationTimes[timerIndex] = expirationTime;
        auto ret = (buffers[timerIndex].action() != CMD_IGNORE);
        timers[timerIndex]->async_wait(timerCallback);
        return ret;
    }
    return false;
}